

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O2

void CPU::WDC65816::ProcessorStorageConstructor::stack_rti
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPCThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPCThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CyclePull);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CyclePull);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CyclePull);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CyclePullIfNotEmulation);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationPerform);
  return;
}

Assistant:

static void stack_rti(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchPCThrowaway);		// IO.
		target(CycleFetchPCThrowaway);		// IO.

		target(CyclePull);					// P.
		target(CyclePull);					// New PCL.
		target(CyclePull);					// New PCH.
		target(CyclePullIfNotEmulation);	// PBR.

		target(OperationPerform);			// [RTI] — to unpack the fields above.
	}